

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

Vec_Wec_t * Gia_Iso2ManPerform(Gia_Man_t *pGia,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Gia_Iso2Man_t *p;
  abctime aVar3;
  Vec_Wec_t *pVVar4;
  
  aVar2 = Abc_Clock();
  p = Gia_Iso2ManStart(pGia);
  Gia_Iso2ManPrepare(pGia);
  Gia_Iso2ManPropagate(pGia);
  aVar3 = Abc_Clock();
  Gia_Iso2ManPrint(p,aVar3 - aVar2,fVerbose);
  while( true ) {
    iVar1 = Gia_Iso2ManUniqify(p);
    aVar3 = Abc_Clock();
    Gia_Iso2ManPrint(p,aVar3 - aVar2,fVerbose);
    if (iVar1 == 0) break;
    Gia_Iso2ManPropagate(pGia);
  }
  Gia_Iso2ManStop(p);
  pVVar4 = Gia_Iso2ManDerivePoClasses(pGia);
  return pVVar4;
}

Assistant:

Vec_Wec_t * Gia_Iso2ManPerform( Gia_Man_t * pGia, int fVerbose )
{
    Gia_Iso2Man_t * p;
    abctime clk = Abc_Clock();
    p = Gia_Iso2ManStart( pGia );
    Gia_Iso2ManPrepare( pGia );
    Gia_Iso2ManPropagate( pGia );
    Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
    while ( Gia_Iso2ManUniqify( p ) )
    {
        Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
        Gia_Iso2ManPropagate( pGia );
    }
    Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
/*
    Gia_Iso2ManUpdate( p, 20 );
    while ( Gia_Iso2ManUniqify( p ) )
    {
        Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
        Gia_Iso2ManPropagate( pGia );
    }
    Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
*/
    Gia_Iso2ManStop( p );
    return Gia_Iso2ManDerivePoClasses( pGia );
}